

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

ssize_t __thiscall icu_63::VTZReader::read(VTZReader *this,int __fd,void *__buf,size_t __nbytes)

{
  short sVar1;
  UnicodeString *this_00;
  char16_t cVar2;
  undefined6 in_register_00000002;
  undefined6 extraout_var;
  int32_t iVar3;
  int32_t offset;
  
  offset = this->index;
  this_00 = this->in;
  sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this_00->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  cVar2 = L'\xffff';
  if (offset < iVar3) {
    cVar2 = icu_63::UnicodeString::doCharAt(this_00,offset);
    offset = this->index;
    in_register_00000002 = extraout_var;
  }
  this->index = offset + 1;
  return CONCAT62(in_register_00000002,cVar2);
}

Assistant:

UChar
VTZReader::read(void) {
    UChar ch = 0xFFFF;
    if (index < in->length()) {
        ch = in->charAt(index);
    }
    index++;
    return ch;
}